

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

archive * archive_read_new(void)

{
  archive_entry *paVar1;
  archive_vtable_conflict *paVar2;
  archive_read *a;
  
  a = (archive_read *)malloc(0x960);
  if (a == (archive_read *)0x0) {
    a = (archive_read *)0x0;
  }
  else {
    memset(a,0,0x960);
    (a->archive).magic = 0xdeb0c5;
    (a->archive).state = 1;
    paVar1 = archive_entry_new2((archive *)a);
    a->entry = paVar1;
    paVar2 = archive_read_vtable();
    (a->archive).vtable = paVar2;
  }
  return &a->archive;
}

Assistant:

struct archive *
archive_read_new(void)
{
	struct archive_read *a;

	a = (struct archive_read *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_READ_MAGIC;

	a->archive.state = ARCHIVE_STATE_NEW;
	a->entry = archive_entry_new2(&a->archive);
	a->archive.vtable = archive_read_vtable();

	return (&a->archive);
}